

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

Builder * __thiscall arangodb::velocypack::Builder::operator=(Builder *this,Builder *that)

{
  Buffer<unsigned_char> *pBVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Builder *pBVar4;
  uchar *puVar5;
  undefined1 local_29;
  Buffer<unsigned_char> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if (this != that) {
    pBVar1 = (that->_buffer).
             super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (pBVar1 == (Buffer<unsigned_char> *)0x0) {
      p_Var2 = (this->_buffer).
               super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (this->_buffer).
      super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (this->_buffer).
      super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      pBVar4 = (Builder *)&that->_bufferPtr;
    }
    else {
      local_28 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<arangodb::velocypack::Buffer<unsigned_char>,std::allocator<arangodb::velocypack::Buffer<unsigned_char>>,arangodb::velocypack::Buffer<unsigned_char>&>
                (&_Stack_20,&local_28,
                 (allocator<arangodb::velocypack::Buffer<unsigned_char>_> *)&local_29,pBVar1);
      _Var3._M_pi = _Stack_20._M_pi;
      pBVar1 = local_28;
      local_28 = (Buffer<unsigned_char> *)0x0;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (this->_buffer).
               super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (this->_buffer).
      super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = pBVar1;
      (this->_buffer).
      super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      pBVar4 = this;
      if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      }
    }
    pBVar1 = (pBVar4->_buffer).
             super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    this->_bufferPtr = pBVar1;
    if (pBVar1 == (Buffer<unsigned_char> *)0x0) {
      puVar5 = (uchar *)0x0;
    }
    else {
      puVar5 = pBVar1->_buffer;
    }
    this->_start = puVar5;
    this->_pos = that->_pos;
    std::
    vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::operator=(&this->_stack,&that->_stack);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->_indexes,&that->_indexes);
    this->_keyWritten = that->_keyWritten;
    this->options = that->options;
  }
  return this;
}

Assistant:

Builder& Builder::operator=(Builder const& that) {
  if (this != &that) {
    if (that._buffer == nullptr) {
      _buffer.reset();
      _bufferPtr = that._bufferPtr;
    } else {
      _buffer = std::make_shared<Buffer<uint8_t>>(*that._buffer);
      _bufferPtr = _buffer.get();
    }
    if (_bufferPtr == nullptr) {
      _start = nullptr;
    } else {
      _start = _bufferPtr->data();
    }
    _pos = that._pos;
    _stack = that._stack;
    _indexes = that._indexes;
    _keyWritten = that._keyWritten;
    options = that.options;
  }
  VELOCYPACK_ASSERT(options != nullptr);
  return *this;
}